

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  string *psVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  int *piVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  string *extraout_RAX;
  undefined8 uVar12;
  char *pcVar13;
  size_type *psVar14;
  bool numOnly;
  bool numOnly_00;
  byte bVar15;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  bool numOnly_01;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 uVar16;
  bool numOnly_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  bool numOnly_03;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  undefined1 extraout_DL_09;
  undefined1 extraout_DL_10;
  undefined1 extraout_DL_11;
  undefined1 extraout_DL_12;
  undefined1 extraout_DL_13;
  char *pcVar17;
  byte bVar18;
  double dVar19;
  string muxstr;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int local_34;
  
  iVar5 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x3);
  if (iVar5 == 0) {
    if (0.1 < mux) {
LAB_001663d5:
      bVar18 = 0;
    }
    else {
      pcVar13 = "L";
      pcVar17 = (char *)0x3;
LAB_00166395:
      bVar18 = 0;
      std::__cxx11::string::replace((ulong)seq,0,pcVar17,(ulong)pcVar13);
      mux = mux * 1000.0;
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x4);
    if (iVar5 == 0) {
      if (mux <= 100.0) goto LAB_001663d5;
      pcVar13 = "L^-1";
      pcVar17 = (char *)0x4;
LAB_001663fa:
      bVar18 = 0;
      std::__cxx11::string::replace((ulong)seq,0,pcVar17,(ulong)pcVar13);
      mux = mux / 1000.0;
    }
    else {
      iVar5 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x5);
      if (iVar5 == 0) {
        bVar18 = 1;
        if (100.0 < mux) {
          pcVar13 = "g^-1";
          pcVar17 = (char *)0x5;
          goto LAB_001663fa;
        }
      }
      else {
        bVar18 = 0;
        iVar5 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x2);
        if (((iVar5 == 0) && (bVar18 = 1, mux <= 0.1)) &&
           ((seq->_M_string_length < 4 || ((seq->_M_dataplus)._M_p[2] != '^')))) {
          pcVar13 = "g";
          pcVar17 = (char *)0x2;
          goto LAB_00166395;
        }
      }
    }
  }
  pcVar13 = (seq->_M_dataplus)._M_p;
  cVar2 = *pcVar13;
  if ((mux == 1.0) && (!NAN(mux))) {
    if (cVar2 == '/') {
      std::__cxx11::string::_M_replace_aux((ulong)seq,0,0,'\x01');
      pcVar13 = (seq->_M_dataplus)._M_p;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &seq->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar13 == paVar1) {
      uVar4 = *(undefined8 *)((long)&seq->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    psVar3 = (string *)seq->_M_string_length;
    __return_storage_ptr__->_M_string_length = (size_type)psVar3;
    (seq->_M_dataplus)._M_p = (pointer)paVar1;
    seq->_M_string_length = 0;
    (seq->field_2)._M_local_buf[0] = '\0';
    return psVar3;
  }
  uVar6 = std::__cxx11::string::find((char)seq,0x5e);
  if (cVar2 != '/') {
    if (uVar6 == 0xffffffffffffffff) {
      getMultiplierString_abi_cxx11_((string *)&local_58,(units *)(ulong)bVar18,mux,numOnly);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 (local_58._M_local_buf,(ulong)(seq->_M_dataplus)._M_p);
    }
    else {
      uVar7 = std::__cxx11::string::find_first_of((char *)seq,0x180aa0,0);
      if (uVar6 <= uVar7) {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)seq);
        uVar4 = local_58._M_allocated_capacity;
        piVar9 = __errno_location();
        local_34 = *piVar9;
        *piVar9 = 0;
        lVar10 = strtol((char *)uVar4,(char **)&local_78,10);
        if (local_78._M_dataplus._M_p == (pointer)uVar4) {
          std::__throw_invalid_argument("stoi");
LAB_00166d64:
          uVar12 = std::__throw_out_of_range("stoi");
          if (local_58._M_allocated_capacity != uVar4) {
            operator_delete((void *)local_58._M_allocated_capacity,
                            CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0])
                            + 1);
          }
          _Unwind_Resume(uVar12);
        }
        if (((int)lVar10 != lVar10) || (*piVar9 == 0x22)) goto LAB_00166d64;
        if (*piVar9 == 0) {
          *piVar9 = local_34;
        }
        uVar16 = extraout_DL;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity != &local_48) {
          operator_delete((void *)local_58._M_allocated_capacity,
                          CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) +
                          1);
          uVar16 = extraout_DL_00;
        }
        local_58._8_8_ = (char *)0x0;
        local_48._M_local_buf[0] = '\0';
        local_58._M_allocated_capacity = (size_type)&local_48;
        switch((int)lVar10) {
        default:
          getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar16);
          std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_00166d28:
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          break;
        case 2:
          if (mux < 0.0) {
            dVar19 = sqrt(mux);
            uVar16 = extraout_DL_11;
          }
          else {
            dVar19 = SQRT(mux);
          }
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,dVar19,(bool)uVar16);
          std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
          uVar16 = extraout_DL_12;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar16 = extraout_DL_13;
          }
          bVar18 = *(byte *)local_58._M_allocated_capacity;
          if (((byte)(bVar18 - 0x30) < 10) ||
             ((bVar18 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar16);
            goto LAB_00166d0e;
          }
          break;
        case 3:
          dVar19 = cbrt(mux);
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,dVar19,numOnly_03);
          std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
          uVar16 = extraout_DL_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar16 = extraout_DL_07;
          }
          bVar18 = *(byte *)local_58._M_allocated_capacity;
          if (((byte)(bVar18 - 0x30) < 10) ||
             ((bVar18 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar16);
            goto LAB_00166d0e;
          }
          break;
        case -3:
          dVar19 = cbrt(1.0 / mux);
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,dVar19,numOnly_01);
          std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
          uVar16 = extraout_DL_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar16 = extraout_DL_02;
          }
          bVar18 = *(byte *)local_58._M_allocated_capacity;
          if (((byte)(bVar18 - 0x30) < 10) ||
             ((bVar18 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar16);
LAB_00166d0e:
            std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_00166d28;
          }
          break;
        case -2:
          dVar19 = 1.0 / mux;
          if (dVar19 < 0.0) {
            dVar19 = sqrt(dVar19);
            uVar16 = extraout_DL_08;
          }
          else {
            dVar19 = SQRT(dVar19);
          }
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,dVar19,(bool)uVar16);
          std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
          uVar16 = extraout_DL_09;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar16 = extraout_DL_10;
          }
          bVar18 = *(byte *)local_58._M_allocated_capacity;
          if (((byte)(bVar18 - 0x30) < 10) ||
             ((bVar18 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar16);
            goto LAB_00166d0e;
          }
          break;
        case -1:
          getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,1.0 / mux,(bool)uVar16);
          std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
          uVar16 = extraout_DL_04;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            uVar16 = extraout_DL_05;
          }
          bVar18 = *(byte *)local_58._M_allocated_capacity;
          if (((byte)(bVar18 - 0x30) < 10) ||
             ((bVar18 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) != 0)))) {
            getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)uVar16);
            goto LAB_00166d0e;
          }
        }
        pbVar11 = std::operator+(__return_storage_ptr__,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_58,seq);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity == &local_48) {
          return pbVar11;
        }
        goto LAB_001669e7;
      }
      getMultiplierString_abi_cxx11_((string *)&local_58,(units *)(ulong)bVar18,mux,numOnly_00);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 (local_58._M_local_buf,(ulong)(seq->_M_dataplus)._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar14 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar14) {
      lVar10 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar10;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_allocated_capacity == &local_48) {
      return (string *)&local_48;
    }
    goto LAB_001669e7;
  }
  if (uVar6 == 0xffffffffffffffff) {
LAB_001665e5:
    local_58._M_allocated_capacity = (size_type)&local_48;
    local_48._M_local_buf[0] = '\0';
    local_58._8_8_ = (char *)0x0;
    getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,1.0 / mux,numOnly);
    std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    bVar18 = *(byte *)local_58._M_allocated_capacity;
    bVar15 = bVar18 - 0x30;
    if ((bVar15 < 10) ||
       ((bVar18 < 0x2f &&
        (bVar15 = false, (0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) != 0)))) {
      getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)bVar15);
      goto LAB_001669a6;
    }
    std::__cxx11::string::replace((ulong)seq,1,(char *)0x0,local_58._M_allocated_capacity);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)local_58._8_8_,0x18553f);
  }
  else {
    cVar2 = (seq->_M_dataplus)._M_p[uVar6 + 1];
    local_58._M_allocated_capacity = (size_type)&local_48;
    local_58._8_8_ = (char *)0x0;
    local_48._M_local_buf[0] = '\0';
    if (cVar2 == '3') {
      dVar19 = cbrt(1.0 / mux);
      getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,dVar19,numOnly_02);
      std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      bVar18 = *(byte *)local_58._M_allocated_capacity;
      bVar15 = bVar18 - 0x30;
      if ((9 < bVar15) &&
         ((0x2e < bVar18 ||
          (bVar15 = false, (0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) == 0)))) {
LAB_00166bd8:
        std::__cxx11::string::replace((ulong)seq,1,(char *)0x0,local_58._M_allocated_capacity);
        std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)local_58._8_8_,0x18553f);
        goto LAB_001669cd;
      }
      getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)bVar15);
LAB_001669a6:
      std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_001669cd;
    }
    else {
      if (cVar2 == '2') {
        dVar19 = 1.0 / mux;
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
          uVar16 = extraout_DL_03;
        }
        else {
          dVar19 = SQRT(dVar19);
          uVar16 = numOnly;
        }
        getMultiplierString_abi_cxx11_(&local_78,(units *)(ulong)bVar18,dVar19,(bool)uVar16);
        std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        bVar18 = *(byte *)local_58._M_allocated_capacity;
        bVar15 = bVar18 - 0x30;
        if ((9 < bVar15) &&
           ((0x2e < bVar18 ||
            (bVar15 = false, (0x680000000000U >> ((ulong)(uint)bVar18 & 0x3f) & 1) == 0))))
        goto LAB_00166bd8;
        getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,(bool)bVar15);
        goto LAB_001669a6;
      }
      if (cVar2 == '1') goto LAB_001665e5;
      getMultiplierString_abi_cxx11_(&local_78,(units *)0x1,mux,numOnly);
      std::__cxx11::string::operator=((string *)local_58._M_local_buf,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_001669cd;
    }
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_001669cd:
  pbVar11 = std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_58,seq);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity == &local_48) {
    return pbVar11;
  }
LAB_001669e7:
  operator_delete((void *)local_58._M_allocated_capacity,
                  CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  return extraout_RAX;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}